

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.hpp
# Opt level: O1

void __thiscall ycqian::thread_pool::thread_pool(thread_pool *this,size_t size)

{
  anon_class_16_1_898a9ca8_for__M_head_impl local_48;
  thread local_38;
  
  (this->data_).super___shared_ptr<ycqian::thread_pool::data,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<ycqian::thread_pool::data,std::allocator<ycqian::thread_pool::data>>
            (&(this->data_).
              super___shared_ptr<ycqian::thread_pool::data,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (data **)this,(allocator<ycqian::thread_pool::data> *)&local_48);
  if (size != 0) {
    do {
      local_48.data.super___shared_ptr<ycqian::thread_pool::data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (this->data_).super___shared_ptr<ycqian::thread_pool::data,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
      local_48.data.super___shared_ptr<ycqian::thread_pool::data,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (this->data_).super___shared_ptr<ycqian::thread_pool::data,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      if (local_48.data.super___shared_ptr<ycqian::thread_pool::data,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_48.data.super___shared_ptr<ycqian::thread_pool::data,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_48.data.
                super___shared_ptr<ycqian::thread_pool::data,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_48.data.super___shared_ptr<ycqian::thread_pool::data,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_48.data.
                super___shared_ptr<ycqian::thread_pool::data,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      std::thread::thread<ycqian::thread_pool::thread_pool(unsigned_long)::_lambda()_1_,,void>
                (&local_38,&local_48);
      std::thread::detach();
      if (local_38._M_id._M_thread != 0) {
        std::terminate();
      }
      if (local_48.data.super___shared_ptr<ycqian::thread_pool::data,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_48.data.
                   super___shared_ptr<ycqian::thread_pool::data,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      size = size - 1;
    } while (size != 0);
  }
  return;
}

Assistant:

explicit thread_pool(size_t size) : data_(std::make_shared<data>()) {
            for (size_t i = 0; i < size; ++i) {
                std::thread([data = data_]{
                    std::unique_lock<std::mutex> lk(data->mutex);
                    for (;;) {
                        if (data->tasks.size()>0) {
                            auto current = data->tasks.front();
                            data->tasks.pop();
                            lk.unlock();
                            current();
                            lk.lock();
                        } else if (data->shutdown) {
                            break;
                        } else {
                            data->cv.wait(lk);
                        }
                    }
                }).detach();
            }
        }